

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::_List_const_iterator<int>const*,std::vector<std::_List_const_iterator<int>,std::allocator<std::_List_const_iterator<int>>>>,boost::use_default,boost::use_default,boost::use_default,boost::use_default>>,std::vector<int,std::allocator<int>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
          *lhs,char *op,vector<int,_std::allocator<int>_> *rhs)

{
  ostream *poVar1;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  poVar1 = tlssPush();
  filldata<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>_>
  ::fill(poVar1,(iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
                 *)this);
  tlssPop();
  String::String(&local_68,(char *)lhs);
  operator+(&local_38,&local_50,&local_68);
  poVar1 = tlssPush();
  test_detail::print_range<std::vector<int,std::allocator<int>>,burst::identity_fn>(poVar1,op);
  tlssPop();
  operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }